

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTPNArglistBase::fold_constants(CTPNArglistBase *this,CTcPrsSymtab *symtab)

{
  undefined8 in_RSI;
  CTPNArglistBase *in_RDI;
  CTPNArg *cur;
  CTPNArgBase *local_18;
  
  for (local_18 = &get_arg_list_head(in_RDI)->super_CTPNArgBase; local_18 != (CTPNArgBase *)0x0;
      local_18 = &CTPNArgBase::get_next_arg(local_18)->super_CTPNArgBase) {
    (*(local_18->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0xf])(local_18,in_RSI);
  }
  return &in_RDI->super_CTcPrsNode;
}

Assistant:

CTcPrsNode *CTPNArglistBase::fold_constants(CTcPrsSymtab *symtab)
{
    /* fold each list element */
    CTPNArg *cur;
    for (cur = get_arg_list_head() ; cur != 0 ; cur = cur->get_next_arg())
        cur->fold_constants(symtab);

    /* return myself with no further folding */
    return this;
}